

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O3

DAngle __thiscall
AActor::AngleTo(AActor *this,AActor *other,double oxofs,double oyofs,bool absolute)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  undefined7 in_register_00000011;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  lVar3 = CONCAT71(in_register_00000011,absolute);
  dVar4 = *(double *)(lVar3 + 0x48);
  dVar5 = *(double *)(lVar3 + 0x50);
  if (in_ECX == 0) {
    iVar1 = *(int *)(*(long *)(lVar3 + 0x130) + 0x208);
    iVar2 = other->Sector->PortalGroup;
    dVar6 = 0.0;
    dVar7 = 0.0;
    if (iVar1 != iVar2) {
      dVar6 = Displacements.data.Array[iVar2 * Displacements.size + iVar1].pos.X;
      dVar7 = Displacements.data.Array[iVar2 * Displacements.size + iVar1].pos.Y;
    }
    dVar4 = dVar4 + dVar6;
    dVar5 = dVar5 + dVar7;
  }
  dVar4 = c_atan2((dVar5 - (other->__Pos).Y) + oyofs,(dVar4 - (other->__Pos).X) + oxofs);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)(dVar4 * 57.29577951308232);
  return (DAngle)(dVar4 * 57.29577951308232);
}

Assistant:

DAngle AngleTo(AActor *other, double oxofs, double oyofs, bool absolute = false) const
	{
		DVector2 otherpos = absolute ? other->Pos() : other->PosRelative(this);
		return VecToAngle(otherpos - Pos() + DVector2(oxofs, oyofs));
	}